

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O1

USTATUS __thiscall
FfsParser::parseGuidedSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  UINT8 subtype;
  UINT8 *ffsSize;
  TreeModel *pTVar4;
  pointer pcVar5;
  bool bVar6;
  size_t __n;
  bool bVar7;
  _Alloc_hider __n_00;
  bool bVar8;
  UINT32 UVar9;
  uint uVar10;
  int iVar11;
  UByteArray *pUVar12;
  uLong uVar13;
  ulong uVar14;
  undefined8 extraout_RAX;
  uint uVar15;
  CBString *this_00;
  USTATUS UVar16;
  ushort uVar17;
  uint uVar18;
  uint uVar19;
  UModelIndex *pUVar20;
  FfsParser *pFVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  byte local_1c0;
  UByteArray local_1a8;
  undefined8 local_188;
  undefined8 local_180;
  UByteArray header;
  UByteArray baGuid;
  CBString additionalInfo;
  size_type __dnew_1;
  UByteArray body;
  _func_int **local_d8;
  UINT8 aUStack_d0 [8];
  TreeModel *local_c8;
  EFI_GUID guid;
  CBString name;
  UModelIndex parentVolumeIndex;
  CBString local_60;
  CBString info;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    return 0x14;
  }
  TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
  bVar8 = false;
  if (((-1 < parentVolumeIndex.r) && (bVar8 = false, -1 < parentVolumeIndex.c)) &&
     (parentVolumeIndex.m != (TreeModel *)0x0)) {
    bVar8 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex);
    if (bVar8) {
      bVar8 = false;
    }
    else {
      TreeModel::parsingData(&baGuid,this->model,&parentVolumeIndex);
      cVar3 = baGuid.d._M_dataplus._M_p[0x19];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)baGuid.d._M_dataplus._M_p != &baGuid.d.field_2) {
        operator_delete(baGuid.d._M_dataplus._M_p);
      }
      bVar8 = cVar3 == '\x03';
    }
  }
  ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
  if ((bVar8) && (UVar9 = uint24ToUint32(ffsSize), UVar9 == 0xffffff)) {
    uVar18 = (uint)(section->d)._M_string_length;
    pUVar20 = index;
    pFVar21 = this;
    if (0x1b < uVar18) {
      guid._0_8_ = *(undefined8 *)(ffsSize + 8);
      guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0x10);
      pUVar20 = (UModelIndex *)(ulong)*(ushort *)(ffsSize + 0x18);
      pFVar21 = (FfsParser *)(ulong)*(ushort *)(ffsSize + 0x1a);
    }
    uVar15 = 0x1c;
    if (uVar18 < 0x1c) {
      return 0x14;
    }
  }
  else {
    guid._0_8_ = *(undefined8 *)(ffsSize + 4);
    guid.Data4 = *(UINT8 (*) [8])(ffsSize + 0xc);
    pUVar20 = (UModelIndex *)(ulong)*(ushort *)(ffsSize + 0x14);
    pFVar21 = (FfsParser *)(ulong)*(ushort *)(ffsSize + 0x16);
    uVar15 = 0x18;
  }
  uVar18 = (uint)pUVar20;
  if ((uint)(section->d)._M_string_length < uVar15) {
    return 0x14;
  }
  Bstrlib::CBString::CBString(&additionalInfo);
  baGuid.d._M_dataplus._M_p = (pointer)&baGuid.d.field_2;
  header.d._M_dataplus._M_p = (pointer)0x10;
  baGuid.d._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&baGuid,(ulong)&header);
  __n_00 = header.d._M_dataplus;
  baGuid.d.field_2._M_allocated_capacity = (size_type)header.d._M_dataplus._M_p;
  *(undefined8 *)baGuid.d._M_dataplus._M_p = guid._0_8_;
  *(UINT8 (*) [8])(baGuid.d._M_dataplus._M_p + 8) = guid.Data4;
  baGuid.d._M_string_length = (size_type)header.d._M_dataplus._M_p;
  baGuid.d._M_dataplus._M_p[header.d._M_dataplus._M_p] = '\0';
  pUVar12 = &EFI_GUIDED_SECTION_CRC32;
  if (header.d._M_dataplus._M_p == (pointer)EFI_GUIDED_SECTION_CRC32.d._M_string_length) {
    if (header.d._M_dataplus._M_p != (pointer)0x0) {
      uVar10 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_CRC32.d._M_dataplus._M_p,
                    (size_t)header.d._M_dataplus._M_p);
      pUVar12 = (UByteArray *)(ulong)uVar10;
      if (uVar10 != 0) goto LAB_0011ef51;
    }
    local_180 = CONCAT44(local_180._4_4_,
                         (int)CONCAT71((int7)((ulong)pUVar12 >> 8),((ulong)pFVar21 & 2) == 0));
    UVar16 = 0x14;
    if ((uint)(section->d)._M_string_length < uVar15 + 4) goto LAB_0011f659;
    uVar15 = *(uint *)((section->d)._M_dataplus._M_p + uVar15);
    Bstrlib::CBString::CBString((CBString *)&header,"\nChecksum type: CRC32");
    Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
    Bstrlib::CBString::~CBString((CBString *)&header);
    uVar13 = crc32(0,(uchar *)((section->d)._M_dataplus._M_p + ((ulong)pUVar20 & 0xffff)),
                   (int)(section->d)._M_string_length - (int)((ulong)pUVar20 & 0xffff));
    if (uVar15 == (uint)uVar13) {
      usprintf((CBString *)&header,"\nChecksum: %08Xh, valid",(ulong)uVar15);
      Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
      Bstrlib::CBString::~CBString((CBString *)&header);
      bVar8 = false;
      goto LAB_0011f14d;
    }
    usprintf((CBString *)&header,"\nChecksum: %08Xh, invalid, should be %08Xh",(ulong)uVar15,
             uVar13 & 0xffffffff);
    Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
    Bstrlib::CBString::~CBString((CBString *)&header);
    bVar7 = true;
    bVar6 = false;
    bVar8 = false;
    bVar23 = false;
LAB_0011f15d:
    uVar1 = (ulong)local_188._4_4_;
    local_1c0 = 0;
LAB_0011f175:
    local_188 = (EFI_GUID *)(uVar1 << 0x20);
    bVar24 = false;
    bVar22 = false;
  }
  else {
LAB_0011ef51:
    if ((((((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMA.d._M_string_length) &&
           ((__n_00._M_p == (pointer)0x0 ||
            (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_LZMA.d._M_dataplus._M_p,
                           (size_t)__n_00._M_p), iVar11 == 0)))) ||
          ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMA_HP.d._M_string_length &&
           ((__n_00._M_p == (pointer)0x0 ||
            (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_LZMA_HP.d._M_dataplus._M_p,
                           (size_t)__n_00._M_p), iVar11 == 0)))))) ||
         ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMA_MS.d._M_string_length &&
          ((__n_00._M_p == (pointer)0x0 ||
           (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_LZMA_MS.d._M_dataplus._M_p,
                          (size_t)__n_00._M_p), iVar11 == 0)))))) ||
        ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_LZMAF86.d._M_string_length &&
         ((__n_00._M_p == (pointer)0x0 ||
          (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_LZMAF86.d._M_dataplus._M_p,
                         (size_t)__n_00._M_p), iVar11 == 0)))))) ||
       (((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_TIANO.d._M_string_length &&
         ((__n_00._M_p == (pointer)0x0 ||
          (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_TIANO.d._M_dataplus._M_p,
                         (size_t)__n_00._M_p), iVar11 == 0)))) ||
        ((__n_00._M_p == (pointer)EFI_GUIDED_SECTION_GZIP.d._M_string_length &&
         ((__n_00._M_p == (pointer)0x0 ||
          (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_GZIP.d._M_dataplus._M_p,
                         (size_t)__n_00._M_p), iVar11 == 0)))))))) {
      bVar8 = ((ulong)pFVar21 & 1) == 0;
      local_180 = local_180 & 0xffffffff00000000;
LAB_0011f14d:
      bVar6 = false;
      bVar23 = false;
LAB_0011f155:
      bVar7 = false;
      goto LAB_0011f15d;
    }
    if ((__n_00._M_p != (pointer)EFI_GUIDED_SECTION_ZLIB_AMD.d._M_string_length) ||
       ((__n_00._M_p != (pointer)0x0 &&
        (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,EFI_GUIDED_SECTION_ZLIB_AMD.d._M_dataplus._M_p,
                       (size_t)__n_00._M_p), iVar11 != 0)))) {
      if ((__n_00._M_p == (pointer)EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_string_length) &&
         ((__n_00._M_p == (pointer)0x0 ||
          (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,
                         EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_dataplus._M_p,(size_t)__n_00._M_p),
          iVar11 == 0)))) {
        bVar23 = ((ulong)pFVar21 & 1) == 0;
        UVar16 = 0x14;
        if ((uint)(section->d)._M_string_length < uVar15 + 0x210) goto LAB_0011f659;
        Bstrlib::CBString::CBString((CBString *)&header,"\nCertificate type: RSA2048/SHA256");
        Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
        uVar18 = uVar18 + 0x210;
        Bstrlib::CBString::~CBString((CBString *)&header);
        bVar6 = true;
        local_180 = (ulong)local_180._4_4_ << 0x20;
        bVar8 = false;
        goto LAB_0011f155;
      }
      if ((__n_00._M_p == (pointer)EFI_FIRMWARE_CONTENTS_SIGNED_GUID.d._M_string_length) &&
         ((__n_00._M_p == (pointer)0x0 ||
          (iVar11 = bcmp(baGuid.d._M_dataplus._M_p,
                         EFI_FIRMWARE_CONTENTS_SIGNED_GUID.d._M_dataplus._M_p,(size_t)__n_00._M_p),
          iVar11 == 0)))) {
        bVar23 = ((ulong)pFVar21 & 1) == 0;
        uVar10 = (uint)(section->d)._M_string_length;
        UVar16 = 0x14;
        if (uVar10 < uVar15 + 8) goto LAB_0011f659;
        pcVar5 = (section->d)._M_dataplus._M_p;
        uVar17 = (short)pUVar20 + *(short *)(pcVar5 + uVar15);
        uVar18 = (uint)uVar17;
        uVar19 = (uint)uVar17;
        bVar6 = uVar10 >= uVar19;
        if (uVar10 < uVar19) {
          local_188 = (EFI_GUID *)((ulong)local_188 & 0xffffffff00000000);
          bVar24 = false;
        }
        else {
          local_180 = (ulong)uVar10;
          if (*(short *)(pcVar5 + (ulong)uVar15 + 6) == 0xef1) {
            Bstrlib::CBString::CBString((CBString *)&header,"\nCertificate type: UEFI");
            Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
            Bstrlib::CBString::~CBString((CBString *)&header);
            pcVar5 = (section->d)._M_dataplus._M_p;
            local_188 = (EFI_GUID *)(pcVar5 + (ulong)uVar15 + 8);
            header.d._M_dataplus._M_p = (pointer)&header.d.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&header,local_188,pcVar5 + (ulong)uVar15 + 0x18);
            __n = CONCAT44(header.d._M_string_length._4_4_,(uint)header.d._M_string_length);
            if (__n == EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_string_length) {
              if (__n == 0) {
                bVar24 = true;
              }
              else {
                iVar11 = bcmp(header.d._M_dataplus._M_p,
                              EFI_CERT_TYPE_RSA2048_SHA256_GUID.d._M_dataplus._M_p,__n);
                bVar24 = iVar11 == 0;
              }
            }
            else {
              bVar24 = false;
            }
            if (bVar24) {
              Bstrlib::CBString::CBString((CBString *)&body,"\nCertificate subtype: RSA2048/SHA256")
              ;
              Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&body);
              this_00 = (CBString *)&body;
            }
            else {
              Bstrlib::CBString::CBString
                        ((CBString *)&local_1a8,"\nCertificate subtype: unknown, GUID ");
              guidToUString(&name,local_188,true);
              Bstrlib::CBString::operator+((CBString *)&body,(CBString *)&local_1a8,&name);
              Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&body);
              Bstrlib::CBString::~CBString((CBString *)&body);
              Bstrlib::CBString::~CBString(&name);
              this_00 = (CBString *)&local_1a8;
            }
            Bstrlib::CBString::~CBString(this_00);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)header.d._M_dataplus._M_p != &header.d.field_2) {
              operator_delete(header.d._M_dataplus._M_p);
            }
            bVar24 = (bool)(bVar24 ^ 1);
            local_188 = (EFI_GUID *)((ulong)local_188 & 0xffffffff00000000);
          }
          else {
            usprintf((CBString *)&header,"\nCertificate type: unknown (%04Xh)");
            Bstrlib::CBString::operator+=(&additionalInfo,(CBString *)&header);
            Bstrlib::CBString::~CBString((CBString *)&header);
            local_188 = (EFI_GUID *)
                        CONCAT44(local_188._4_4_,(int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1));
            bVar24 = false;
          }
          uVar10 = (uint)local_180;
        }
        if (uVar10 < uVar19) goto LAB_0011f659;
        local_180 = local_180 & 0xffffffff00000000;
        bVar8 = false;
        bVar7 = false;
        local_1c0 = 0;
        bVar22 = false;
        goto LAB_0011f178;
      }
      local_1c0 = (byte)pFVar21 & 1;
      bVar6 = false;
      local_180 = local_180 & 0xffffffff00000000;
      bVar8 = false;
      bVar23 = false;
      bVar7 = false;
      uVar1 = (ulong)local_188 >> 0x20;
      goto LAB_0011f175;
    }
    uVar14 = (ulong)(uint)(section->d)._M_string_length;
    uVar1 = (ulong)uVar15 + 0x100;
    UVar16 = 0x14;
    if (uVar14 < uVar1) goto LAB_0011f659;
    bVar8 = ((ulong)pFVar21 & 1) == 0;
    bVar22 = uVar1 + *(uint *)((section->d)._M_dataplus._M_p + (ulong)uVar15 + 0x14) != uVar14;
    uVar18 = uVar18 + 0x100;
    bVar6 = false;
    local_180 = local_180 & 0xffffffff00000000;
    bVar23 = false;
    bVar7 = false;
    local_188 = (EFI_GUID *)((ulong)local_188 & 0xffffffff00000000);
    bVar24 = false;
    local_1c0 = 0;
  }
LAB_0011f178:
  UByteArray::left(&header,section,uVar18 & 0xffff);
  UByteArray::mid(&body,section,uVar18 & 0xffff,-1);
  guidToUString(&name,&guid,true);
  Bstrlib::CBString::CBString((CBString *)&local_d8,"Section GUID: ");
  guidToUString((CBString *)&__dnew_1,&guid,false);
  Bstrlib::CBString::operator+((CBString *)&local_1a8,(CBString *)&local_d8,(CBString *)&__dnew_1);
  uVar15 = (uint)(section->d)._M_string_length;
  usprintf(&local_60,
           "\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh"
           ,(ulong)ffsSize[3],(ulong)uVar15,(ulong)uVar15,(ulong)(uint)header.d._M_string_length,
           (ulong)(uint)header.d._M_string_length,(ulong)(uint)body.d._M_string_length,
           (ulong)(uint)body.d._M_string_length,(ulong)pFVar21 & 0xffff);
  Bstrlib::CBString::operator+(&info,(CBString *)&local_1a8,&local_60);
  Bstrlib::CBString::~CBString(&local_60);
  Bstrlib::CBString::~CBString((CBString *)&local_1a8);
  Bstrlib::CBString::~CBString((CBString *)&__dnew_1);
  Bstrlib::CBString::~CBString((CBString *)&local_d8);
  Bstrlib::CBString::operator+=(&info,&additionalInfo);
  if (insertIntoTree) {
    pTVar4 = this->model;
    subtype = ffsSize[3];
    Bstrlib::CBString::CBString((CBString *)&__dnew_1);
    paVar2 = &local_1a8.d.field_2;
    local_1a8.d._M_string_length = 0;
    local_1a8.d.field_2._M_allocated_capacity =
         local_1a8.d.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8.d._M_dataplus._M_p = (pointer)paVar2;
    TreeModel::addItem((UModelIndex *)&local_d8,pTVar4,localOffset,'C',subtype,&name,
                       (CBString *)&__dnew_1,&info,&header,&body,&local_1a8,Movable,parent,'\0');
    index->m = local_c8;
    *(_func_int ***)index = local_d8;
    index->i = (uint64_t)aUStack_d0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.d._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8.d._M_dataplus._M_p);
    }
    Bstrlib::CBString::~CBString((CBString *)&__dnew_1);
    local_d8 = (_func_int **)guid._0_8_;
    aUStack_d0[0] = guid.Data4[0];
    aUStack_d0[1] = guid.Data4[1];
    aUStack_d0[2] = guid.Data4[2];
    aUStack_d0[3] = guid.Data4[3];
    aUStack_d0[4] = guid.Data4[4];
    aUStack_d0[5] = guid.Data4[5];
    aUStack_d0[6] = guid.Data4[6];
    aUStack_d0[7] = guid.Data4[7];
    pTVar4 = this->model;
    __dnew_1 = 0x14;
    local_1a8.d._M_dataplus._M_p = (pointer)paVar2;
    local_1a8.d._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_1a8,(ulong)&__dnew_1);
    local_1a8.d.field_2._M_allocated_capacity = __dnew_1;
    *(_func_int ***)local_1a8.d._M_dataplus._M_p = local_d8;
    *(UINT8 (*) [8])((long)local_1a8.d._M_dataplus._M_p + 8) = aUStack_d0;
    *(undefined4 *)((long)local_1a8.d._M_dataplus._M_p + 0x10) = 0;
    local_1a8.d._M_string_length = __dnew_1;
    local_1a8.d._M_dataplus._M_p[__dnew_1] = '\0';
    TreeModel::setParsingData(pTVar4,index,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.d._M_dataplus._M_p != paVar2) {
      operator_delete(local_1a8.d._M_dataplus._M_p);
    }
    if (bVar6) {
      usprintf((CBString *)&local_1a8,
               "%s: GUIDed section signature may become invalid after modification",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if ((char)local_180 != '\0') {
      usprintf((CBString *)&local_1a8,"%s: CRC32 GUIDed section without AuthStatusValid attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if (bVar8) {
      usprintf((CBString *)&local_1a8,
               "%s: compressed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if (bVar23) {
      usprintf((CBString *)&local_1a8,
               "%s: signed GUIDed section without ProcessingRequired attribute",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if (bVar7) {
      usprintf((CBString *)&local_1a8,"%s: CRC32 GUIDed section with invalid checksum",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if ((char)local_188 != '\0') {
      usprintf((CBString *)&local_1a8,"%s: signed GUIDed section with unknown certificate type",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if (bVar24) {
      usprintf((CBString *)&local_1a8,"%s: signed GUIDed section with unknown certificate subtype",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if (local_1c0 != 0) {
      usprintf((CBString *)&local_1a8,
               "%s: processing required bit set for GUIDed section with unknown GUID",
               "parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
    if (bVar22) {
      usprintf((CBString *)&local_1a8,"%s: AMD Zlib-compressed section with invalid compressed size"
               ,"parseGuidedSectionHeader");
      msg(this,(CBString *)&local_1a8,index);
      Bstrlib::CBString::~CBString((CBString *)&local_1a8);
    }
  }
  Bstrlib::CBString::~CBString(&info);
  Bstrlib::CBString::~CBString(&name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)body.d._M_dataplus._M_p != &body.d.field_2) {
    operator_delete(body.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)header.d._M_dataplus._M_p != &header.d.field_2) {
    operator_delete(header.d._M_dataplus._M_p);
  }
  UVar16 = 0;
LAB_0011f659:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)baGuid.d._M_dataplus._M_p != &baGuid.d.field_2) {
    operator_delete(baGuid.d._M_dataplus._M_p);
  }
  Bstrlib::CBString::~CBString(&additionalInfo);
  return UVar16;
}

Assistant:

USTATUS FfsParser::parseGuidedSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER))
        return U_INVALID_SECTION;
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    UINT32 headerSize;
    EFI_GUID guid;
    UINT16 dataOffset;
    UINT16 attributes;
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    const EFI_COMMON_SECTION_HEADER2* section2Header = (const EFI_COMMON_SECTION_HEADER2*)(section.constData());
    
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED) { // Check for extended header section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(section2Header + 1);
        if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION))
            return U_INVALID_SECTION;
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    else { // Normal section
        const EFI_GUID_DEFINED_SECTION* guidDefinedSectionHeader = (const EFI_GUID_DEFINED_SECTION*)(sectionHeader + 1);
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER) + sizeof(EFI_GUID_DEFINED_SECTION);
        guid = guidDefinedSectionHeader->SectionDefinitionGuid;
        dataOffset = guidDefinedSectionHeader->DataOffset;
        attributes = guidDefinedSectionHeader->Attributes;
    }
    // Check sanity again
    if ((UINT32)section.size() < headerSize)
        return U_INVALID_SECTION;
    
    // Check for special GUIDed sections
    UString additionalInfo;
    UByteArray baGuid((const char*)&guid, sizeof(EFI_GUID));
    bool msgSignedSectionFound = false;
    bool msgNoAuthStatusAttribute = false;
    bool msgNoProcessingRequiredAttributeCompressed = false;
    bool msgNoProcessingRequiredAttributeSigned = false;
    bool msgInvalidCrc = false;
    bool msgUnknownCertType = false;
    bool msgUnknownCertSubtype = false;
    bool msgProcessingRequiredAttributeOnUnknownGuidedSection = false;
    bool msgInvalidCompressedSize = false;
    if (baGuid == EFI_GUIDED_SECTION_CRC32) {
        if ((attributes & EFI_GUIDED_SECTION_AUTH_STATUS_VALID) == 0) { // Check that AuthStatusValid attribute is set on compressed GUIDed sections
            msgNoAuthStatusAttribute = true;
        }
        
        if ((UINT32)section.size() < headerSize + sizeof(UINT32))
            return U_INVALID_SECTION;
        
        UINT32 crc = *(UINT32*)(section.constData() + headerSize);
        additionalInfo += UString("\nChecksum type: CRC32");
        // Calculate CRC32 of section data
        UINT32 calculated = (UINT32)crc32(0, (const UINT8*)section.constData() + dataOffset, (uInt)(section.size() - dataOffset));
        if (crc == calculated) {
            additionalInfo += usprintf("\nChecksum: %08Xh, valid", crc);
        }
        else {
            additionalInfo += usprintf("\nChecksum: %08Xh, invalid, should be %08Xh", crc, calculated);
            msgInvalidCrc = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_LZMA
        || baGuid == EFI_GUIDED_SECTION_LZMA_HP
        || baGuid == EFI_GUIDED_SECTION_LZMA_MS
        || baGuid == EFI_GUIDED_SECTION_LZMAF86
        || baGuid == EFI_GUIDED_SECTION_TIANO
        || baGuid == EFI_GUIDED_SECTION_GZIP) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }
        // No need to change dataOffset here
    }
    else if (baGuid == EFI_GUIDED_SECTION_ZLIB_AMD) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on compressed GUIDed sections
            msgNoProcessingRequiredAttributeCompressed = true;
        }

        if ((UINT32)section.size() < headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER))
            return U_INVALID_SECTION;

        const EFI_AMD_ZLIB_SECTION_HEADER* amdZlibSectionHeader = (const EFI_AMD_ZLIB_SECTION_HEADER*)(section.constData() + headerSize);

        // Check the compressed size to be sane
        if ((UINT32)section.size() != headerSize + sizeof(EFI_AMD_ZLIB_SECTION_HEADER) + amdZlibSectionHeader->CompressedSize) {
            msgInvalidCompressedSize = true;
        }

        // Adjust dataOffset
        dataOffset += sizeof(EFI_AMD_ZLIB_SECTION_HEADER);
    }
    else if (baGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(EFI_CERT_BLOCK_RSA2048_SHA256))
            return U_INVALID_SECTION;
        
        // Adjust dataOffset
        dataOffset += sizeof(EFI_CERT_BLOCK_RSA2048_SHA256);
        additionalInfo += UString("\nCertificate type: RSA2048/SHA256");
        msgSignedSectionFound = true;
    }
    else if (baGuid == EFI_FIRMWARE_CONTENTS_SIGNED_GUID) {
        if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == 0) { // Check that ProcessingRequired attribute is set on signed GUIDed sections
            msgNoProcessingRequiredAttributeSigned = true;
        }
        
        // Get certificate type and length
        if ((UINT32)section.size() < headerSize + sizeof(WIN_CERTIFICATE))
            return U_INVALID_SECTION;
        
        const WIN_CERTIFICATE* winCertificate = (const WIN_CERTIFICATE*)(section.constData() + headerSize);
        UINT32 certLength = winCertificate->Length;
        UINT16 certType = winCertificate->CertificateType;
        
        // Adjust dataOffset
        dataOffset += certLength;
        
        // Check section size once again
        if ((UINT32)section.size() < dataOffset)
            return U_INVALID_SECTION;
        
        // Check certificate type
        if (certType == WIN_CERT_TYPE_EFI_GUID) {
            additionalInfo += UString("\nCertificate type: UEFI");
            
            // Get certificate GUID
            const WIN_CERTIFICATE_UEFI_GUID* winCertificateUefiGuid = (const WIN_CERTIFICATE_UEFI_GUID*)(section.constData() + headerSize);
            UByteArray certTypeGuid((const char*)&winCertificateUefiGuid->CertType, sizeof(EFI_GUID));
            
            if (certTypeGuid == EFI_CERT_TYPE_RSA2048_SHA256_GUID) {
                additionalInfo += UString("\nCertificate subtype: RSA2048/SHA256");
            }
            else {
                additionalInfo += UString("\nCertificate subtype: unknown, GUID ") + guidToUString(winCertificateUefiGuid->CertType);
                msgUnknownCertSubtype = true;
            }
        }
        else {
            additionalInfo += usprintf("\nCertificate type: unknown (%04Xh)", certType);
            msgUnknownCertType = true;
        }
        msgSignedSectionFound = true;
    }
    // Check that ProcessingRequired attribute is not set on GUIDed sections with unknown GUID
    else if ((attributes & EFI_GUIDED_SECTION_PROCESSING_REQUIRED) == EFI_GUIDED_SECTION_PROCESSING_REQUIRED) {
        msgProcessingRequiredAttributeOnUnknownGuidedSection = true;
    }
    
    UByteArray header = section.left(dataOffset);
    UByteArray body = section.mid(dataOffset);
    
    // Get info
    UString name = guidToUString(guid);
    UString info = UString("Section GUID: ") + guidToUString(guid, false) +
    usprintf("\nType: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)\nAttributes: %04Xh",
             sectionHeader->Type,
             (UINT32)section.size(), (UINT32)section.size(),
             (UINT32)header.size(), (UINT32)header.size(),
             (UINT32)body.size(), (UINT32)body.size(),
             attributes);
    
    // Append additional info
    info += additionalInfo;
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, sectionHeader->Type, name, UString(), info, header, body, UByteArray(), Movable, parent);
        
        // Set parsing data
        GUIDED_SECTION_PARSING_DATA pdata = {};
        pdata.guid = guid;
        model->setParsingData(index, UByteArray((const char*)&pdata, sizeof(pdata)));
        
        // Show messages
        if (msgSignedSectionFound)
            msg(usprintf("%s: GUIDed section signature may become invalid after modification", __FUNCTION__), index);
        if (msgNoAuthStatusAttribute)
            msg(usprintf("%s: CRC32 GUIDed section without AuthStatusValid attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeCompressed)
            msg(usprintf("%s: compressed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgNoProcessingRequiredAttributeSigned)
            msg(usprintf("%s: signed GUIDed section without ProcessingRequired attribute", __FUNCTION__), index);
        if (msgInvalidCrc)
            msg(usprintf("%s: CRC32 GUIDed section with invalid checksum", __FUNCTION__), index);
        if (msgUnknownCertType)
            msg(usprintf("%s: signed GUIDed section with unknown certificate type", __FUNCTION__), index);
        if (msgUnknownCertSubtype)
            msg(usprintf("%s: signed GUIDed section with unknown certificate subtype", __FUNCTION__), index);
        if (msgProcessingRequiredAttributeOnUnknownGuidedSection)
            msg(usprintf("%s: processing required bit set for GUIDed section with unknown GUID", __FUNCTION__), index);
        if (msgInvalidCompressedSize)
            msg(usprintf("%s: AMD Zlib-compressed section with invalid compressed size", __FUNCTION__), index);
    }
    
    return U_SUCCESS;
}